

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook.c
# Opt level: O0

void funchook_set_error_message(funchook_t *funchook,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag *in_stack_ffffffffffffff08;
  char *fmt_00;
  undefined4 *__arg;
  funchook_t *funchook_00;
  char local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined4 local_28;
  undefined4 local_24;
  funchook_t *local_20;
  char *local_18;
  char *local_10;
  long local_8;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  fmt_00 = local_d8;
  funchook_00 = (funchook_t *)&stack0x00000008;
  local_24 = 0x30;
  local_28 = 0x10;
  __arg = &local_28;
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  local_20 = funchook_00;
  local_18 = fmt_00;
  local_10 = in_RSI;
  local_8 = in_RDI;
  vsnprintf((char *)(in_RDI + 0x10),200,in_RSI,__arg);
  local_24 = 0x30;
  local_28 = 0x10;
  local_20 = funchook_00;
  local_18 = fmt_00;
  funchook_logv(funchook_00,(int)((ulong)__arg >> 0x20),fmt_00,in_stack_ffffffffffffff08);
  return;
}

Assistant:

void funchook_set_error_message(funchook_t *funchook, const char *fmt, ...)
{
    va_list ap;

    va_start(ap, fmt);
    vsnprintf(funchook->error_message, FUNCHOOK_MAX_ERROR_MESSAGE_LEN, fmt, ap);
    va_end(ap);
    va_start(ap, fmt);
    funchook_logv(funchook, 1, fmt, ap);
    va_end(ap);
}